

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O1

int pmbtoken_exp1_hash_s(EC_GROUP *group,EC_JACOBIAN *out,EC_AFFINE *t,uint8_t *s)

{
  int iVar1;
  uint uVar2;
  uint8_t *buf;
  size_t len;
  CBB cbb;
  uint8_t kHashSLabel [30];
  uint8_t *local_88;
  size_t local_80;
  CBB local_78;
  uint8_t local_48 [32];
  
  builtin_memcpy(local_48 + 0x10,"ment V1 HashS",0xe);
  builtin_memcpy(local_48,"PMBTokens Experi",0x10);
  local_88 = (uint8_t *)0x0;
  uVar2 = 0;
  iVar1 = CBB_init(&local_78,0);
  if (iVar1 != 0) {
    iVar1 = point_to_cbb(&local_78,group,t);
    if (iVar1 != 0) {
      iVar1 = CBB_add_bytes(&local_78,s,0x40);
      if (iVar1 != 0) {
        iVar1 = CBB_finish(&local_78,&local_88,&local_80);
        uVar2 = 0;
        if (iVar1 != 0) {
          iVar1 = ec_hash_to_curve_p384_xmd_sha512_sswu_draft07
                            (group,out,local_48,0x1e,local_88,local_80);
          uVar2 = (uint)(iVar1 != 0);
        }
      }
    }
  }
  OPENSSL_free(local_88);
  CBB_cleanup(&local_78);
  return uVar2;
}

Assistant:

static int pmbtoken_exp1_hash_s(const EC_GROUP *group, EC_JACOBIAN *out,
                                const EC_AFFINE *t,
                                const uint8_t s[TRUST_TOKEN_NONCE_SIZE]) {
  const uint8_t kHashSLabel[] = "PMBTokens Experiment V1 HashS";
  int ret = 0;
  CBB cbb;
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) || !point_to_cbb(&cbb, group, t) ||
      !CBB_add_bytes(&cbb, s, TRUST_TOKEN_NONCE_SIZE) ||
      !CBB_finish(&cbb, &buf, &len) ||
      !ec_hash_to_curve_p384_xmd_sha512_sswu_draft07(
          group, out, kHashSLabel, sizeof(kHashSLabel), buf, len)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(buf);
  CBB_cleanup(&cbb);
  return ret;
}